

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nsc_line_to_tag(char *buf,size_t size,char *tag,size_t max_tag,lws_usec_t *pexpiry)

{
  char *pcVar1;
  longlong lVar2;
  bool bVar3;
  char local_98 [8];
  char col [64];
  size_t bn;
  lws_usec_t expiry;
  int local_40;
  int tl;
  int idx;
  int n;
  lws_usec_t *pexpiry_local;
  size_t max_tag_local;
  char *tag_local;
  size_t size_local;
  char *buf_local;
  
  local_40 = 0;
  expiry._4_4_ = 0;
  bn = 0;
  col[0x38] = '\0';
  col[0x39] = '\0';
  col[0x3a] = '\0';
  col[0x3b] = '\0';
  col[0x3c] = '\0';
  col[0x3d] = '\0';
  col[0x3e] = '\0';
  col[0x3f] = '\0';
  if (size < 3) {
    buf_local._4_4_ = 1;
  }
  else {
    for (; (ulong)col._56_8_ < size && local_40 < 6; local_40 = local_40 + 1) {
      tl = 0;
      while( true ) {
        bVar3 = false;
        if (((ulong)col._56_8_ < size) && (bVar3 = false, tl < 0x3f)) {
          bVar3 = buf[col._56_8_] != '\t';
        }
        if (!bVar3) break;
        pcVar1 = buf + col._56_8_;
        col._56_8_ = col._56_8_ + 1;
        local_98[tl] = *pcVar1;
        tl = tl + 1;
      }
      local_98[tl] = '\0';
      if (buf[col._56_8_] == '\t') {
        col._56_8_ = col._56_8_ + 1;
      }
      switch(local_40) {
      case 0:
      case 2:
      case 5:
        if ((int)max_tag < expiry._4_4_ + tl + 2) {
          return 1;
        }
        if (expiry._4_4_ != 0) {
          tag[expiry._4_4_] = '|';
          expiry._4_4_ = expiry._4_4_ + 1;
        }
        memcpy(tag + expiry._4_4_,local_98,(long)tl);
        expiry._4_4_ = tl + expiry._4_4_;
        tag[expiry._4_4_] = '\0';
        break;
      default:
        break;
      case 4:
        lVar2 = atoll(local_98);
        bn = lVar2 * 1000000;
      }
    }
    if (pexpiry != (lws_usec_t *)0x0) {
      *pexpiry = bn;
    }
    _lws_log(8,"%s: %.*s: tag \'%s\'\n","nsc_line_to_tag",size & 0xffffffff,buf,tag);
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

static int
nsc_line_to_tag(const char *buf, size_t size, char *tag, size_t max_tag,
		lws_usec_t *pexpiry)
{
	int n, idx = 0, tl = 0;
	lws_usec_t expiry = 0;
	size_t bn = 0;
	char col[64];

	if (size < 3)
		return 1;

	while (bn < size && idx <= NSC_COL_NAME) {

		n = 0;
		while (bn < size && n < (int)sizeof(col) - 1 &&
		       buf[bn] != '\t')
			col[n++] = buf[bn++];
		col[n] = '\0';
		if (buf[bn] == '\t')
			bn++;

		switch (idx) {
		case NSC_COL_EXPIRY:
			expiry = (lws_usec_t)((unsigned long long)atoll(col) *
					(lws_usec_t)LWS_US_PER_SEC);
			break;

		case NSC_COL_HOST:
		case NSC_COL_PATH:
		case NSC_COL_NAME:

			/*
			 * As we match the pieces of the wildcard,
			 * compose the matches into a specific tag
			 */

			if (tl + n + 2 > (int)max_tag)
				return 1;
			if (tl)
				tag[tl++] = LWSCTAG_SEP;
			memcpy(tag + tl, col, (size_t)n);
			tl += n;
			tag[tl] = '\0';
			break;
		default:
			break;
		}

		idx++;
	}

	if (pexpiry)
		*pexpiry = expiry;

	lwsl_info("%s: %.*s: tag '%s'\n", __func__, (int)size, buf, tag);

	return 0;
}